

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

Expression *
slang::ast::UnbasedUnsizedIntegerLiteral::fromSyntax
          (Compilation *compilation,LiteralExpressionSyntax *syntax)

{
  bool bVar1;
  Type *args;
  UnbasedUnsizedIntegerLiteral *pUVar2;
  IntegralFlags local_31;
  SourceRange local_30;
  bitmask<slang::ast::IntegralFlags> local_1a;
  logic_t local_19;
  LiteralExpressionSyntax *pLStack_18;
  logic_t val;
  LiteralExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  pLStack_18 = syntax;
  if ((syntax->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind !=
      UnbasedUnsizedLiteralExpression) {
    assert::assertFailed
              ("syntax.kind == SyntaxKind::UnbasedUnsizedLiteralExpression",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
               ,0x84,
               "static Expression &slang::ast::UnbasedUnsizedIntegerLiteral::fromSyntax(Compilation &, const LiteralExpressionSyntax &)"
              );
  }
  local_19 = parsing::Token::bitValue(&syntax->literal);
  bVar1 = logic_t::isUnknown(&local_19);
  local_31 = FourState;
  if (!bVar1) {
    local_31 = TwoState;
  }
  bitmask<slang::ast::IntegralFlags>::bitmask(&local_1a,local_31);
  args = Compilation::getType(compilation,1,local_1a);
  local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pLStack_18);
  pUVar2 = BumpAllocator::
           emplace<slang::ast::UnbasedUnsizedIntegerLiteral,slang::ast::Type_const&,slang::logic_t&,slang::SourceRange>
                     (&compilation->super_BumpAllocator,args,&local_19,&local_30);
  return &pUVar2->super_Expression;
}

Assistant:

Expression& UnbasedUnsizedIntegerLiteral::fromSyntax(Compilation& compilation,
                                                     const LiteralExpressionSyntax& syntax) {
    ASSERT(syntax.kind == SyntaxKind::UnbasedUnsizedLiteralExpression);

    // UnsizedUnbasedLiteralExpressions default to a size of 1 in an undetermined
    // context, but can grow to be wider during propagation.
    logic_t val = syntax.literal.bitValue();
    return *compilation.emplace<UnbasedUnsizedIntegerLiteral>(
        compilation.getType(1,
                            val.isUnknown() ? IntegralFlags::FourState : IntegralFlags::TwoState),
        val, syntax.sourceRange());
}